

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_audit.cpp
# Opt level: O1

void compare_struct_field(t_field *newField,t_field *oldField,string *oldStructName)

{
  e_req eVar1;
  e_req eVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  string fieldName;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  bVar4 = compare_type(newField->type_,oldField->type_);
  if (!bVar4) {
    thrift_audit_failure
              ("Struct Field Type Changed for Id = %d in %s \n",(ulong)(uint)newField->key_,
               (oldStructName->_M_dataplus)._M_p);
  }
  eVar1 = newField->req_;
  eVar2 = oldField->req_;
  if ((eVar1 != T_REQUIRED) != (eVar2 != T_REQUIRED)) {
    thrift_audit_failure
              ("Struct Field Requiredness Changed for Id = %d in %s \n",(ulong)(uint)newField->key_,
               (oldStructName->_M_dataplus)._M_p);
  }
  if (eVar2 != T_REQUIRED || eVar1 != T_REQUIRED) {
    bVar4 = compare_defaults(newField->value_,oldField->value_);
    if (!bVar4) {
      thrift_audit_warning
                (1,"Default value changed for Id = %d in %s \n",(ulong)(uint)newField->key_,
                 (oldStructName->_M_dataplus)._M_p);
    }
  }
  pcVar3 = (newField->name_)._M_dataplus._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + (newField->name_)._M_string_length);
  if (local_48 == (oldField->name_)._M_string_length) {
    if (local_48 == 0) goto LAB_0013737f;
    iVar5 = bcmp(local_50,(oldField->name_)._M_dataplus._M_p,local_48);
    if (iVar5 == 0) goto LAB_0013737f;
  }
  thrift_audit_warning
            (1,"Struct field name changed for Id = %d in %s\n",(ulong)(uint)newField->key_,
             (oldStructName->_M_dataplus)._M_p);
LAB_0013737f:
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

void compare_struct_field(t_field* newField, t_field* oldField, std::string oldStructName)
{
   t_type* newFieldType = newField->get_type();
   t_type* oldFieldType = oldField->get_type();
   if(!compare_type(newFieldType, oldFieldType))
   {
      thrift_audit_failure("Struct Field Type Changed for Id = %d in %s \n", newField->get_key(), oldStructName.c_str());
   }

   // A Struct member can be optional if it is mentioned explicitly, or if it is assigned with default values.
   bool newStructFieldOptional = (newField->get_req() != t_field::T_REQUIRED);
   bool oldStructFieldOptional = (oldField->get_req() != t_field::T_REQUIRED);

   if(newStructFieldOptional != oldStructFieldOptional)
   {
      thrift_audit_failure("Struct Field Requiredness Changed for Id = %d in %s \n", newField->get_key(), oldStructName.c_str());
   }
   if(newStructFieldOptional || oldStructFieldOptional)
   {
      if(!compare_defaults(newField->get_value(), oldField->get_value()))
      {
         thrift_audit_warning(1, "Default value changed for Id = %d in %s \n", newField->get_key(), oldStructName.c_str());
      }
   }

   std::string fieldName = newField->get_name();
   if(fieldName != oldField->get_name())
   {
      thrift_audit_warning(1, "Struct field name changed for Id = %d in %s\n", newField->get_key(), oldStructName.c_str());
   }

}